

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Swap(ExtensionSet *this,ExtensionSet *x)

{
  uint16 uVar1;
  AllocatedData AVar2;
  undefined1 local_38 [8];
  ExtensionSet extension_set;
  
  if (this->arena_ == x->arena_) {
    uVar1 = this->flat_capacity_;
    this->flat_capacity_ = x->flat_capacity_;
    x->flat_capacity_ = uVar1;
    uVar1 = this->flat_size_;
    this->flat_size_ = x->flat_size_;
    x->flat_size_ = uVar1;
    AVar2 = this->map_;
    this->map_ = x->map_;
    x->map_ = AVar2;
  }
  else {
    ExtensionSet((ExtensionSet *)local_38);
    MergeFrom((ExtensionSet *)local_38,x);
    Clear(x);
    MergeFrom(x,this);
    Clear(this);
    MergeFrom(this,(ExtensionSet *)local_38);
    ~ExtensionSet((ExtensionSet *)local_38);
  }
  return;
}

Assistant:

void ExtensionSet::Swap(ExtensionSet* x) {
  if (GetArena() == x->GetArena()) {
    using std::swap;
    swap(flat_capacity_, x->flat_capacity_);
    swap(flat_size_, x->flat_size_);
    swap(map_, x->map_);
  } else {
    // TODO(cfallin, rohananil): We maybe able to optimize a case where we are
    // swapping from heap to arena-allocated extension set, by just Own()'ing
    // the extensions.
    ExtensionSet extension_set;
    extension_set.MergeFrom(*x);
    x->Clear();
    x->MergeFrom(*this);
    Clear();
    MergeFrom(extension_set);
  }
}